

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.cpp
# Opt level: O2

void __thiscall rw::Image::convertTo32(Image *this)

{
  uint uVar1;
  uint8 *puVar2;
  int iVar3;
  uint8 *puVar4;
  uint8 *__ptr;
  uint8 *puVar5;
  uint8 *puVar6;
  int x;
  int iVar7;
  code *pcVar8;
  int iVar9;
  uint8 *line;
  long lVar10;
  uint8 *puVar11;
  
  uVar1 = this->depth << 0x1e | this->depth - 4U >> 2;
  if (uVar1 < 2) {
    unpalettize(this,true);
    return;
  }
  puVar6 = this->pixels;
  if (uVar1 == 3) {
    pcVar8 = conv_RGBA8888_from_ARGB1555;
  }
  else {
    if (uVar1 != 5) {
      return;
    }
    pcVar8 = conv_RGBA8888_from_RGB888;
  }
  lVar10 = (long)this->width * 4;
  allocLocation =
       "file: /workspace/llm4binary/github/license_c_cmakelists/aap[P]librw/src/image.cpp line: 650"
  ;
  __ptr = (uint8 *)0x30018;
  puVar2 = (uint8 *)(*DAT_00144da8)(this->height * lVar10);
  iVar9 = (int)lVar10;
  puVar4 = puVar2;
  for (iVar3 = 0; iVar3 < this->height; iVar3 = iVar3 + 1) {
    puVar5 = puVar4;
    puVar11 = puVar6;
    for (iVar7 = 0; iVar7 < this->width; iVar7 = iVar7 + 1) {
      __ptr = puVar11;
      (*pcVar8)(puVar5);
      puVar11 = puVar11 + this->bpp;
      puVar5 = puVar5 + 4;
    }
    puVar6 = puVar6 + this->stride;
    puVar4 = puVar4 + iVar9;
  }
  free(this,__ptr);
  this->depth = 0x20;
  this->bpp = 4;
  this->stride = iVar9;
  this->palette = (uint8 *)0x0;
  this->pixels = puVar2;
  *(byte *)&this->flags = (byte)this->flags | 1;
  return;
}

Assistant:

void
Image::convertTo32(void)
{
	assert(this->pixels);
	uint8 *pixels = this->pixels;
	int32 newstride = this->width*4;
	uint8 *newpixels;

	void (*fun)(uint8 *out, uint8 *in) = nil;
	switch(this->depth){
	case 4:
	case 8:
		assert(this->palette);
		this->unpalettize(true);
		return;
	case 16:
		fun = conv_RGBA8888_from_ARGB1555;
		break;
	case 24:
		fun = conv_RGBA8888_from_RGB888;
		break;
	default:
		return;
	}

	newpixels = rwNewT(uint8, newstride*this->height, MEMDUR_EVENT | ID_IMAGE);
	uint8 *pixels32 = newpixels;
	for(int y = 0; y < this->height; y++){
		uint8 *line = pixels;
		uint8 *newline = newpixels;
		for(int x = 0; x < this->width; x++){
			fun(newline, line);
			line += this->bpp;
			newline += 4;
		}
		pixels += this->stride;
		newpixels += newstride;
	}

	this->free();
	this->depth = 32;
	this->bpp = 4;
	this->stride = newstride;
	this->pixels = nil;
	this->palette = nil;
	this->setPixels(pixels32);
}